

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall r_exec::CSTOverlay::inject_production(CSTOverlay *this)

{
  CSTController *this_00;
  bool bVar1;
  int iVar2;
  HLPBindingMap *pHVar3;
  _Fact *p_Var4;
  ulong uVar5;
  size_type sVar6;
  uint64_t uVar7;
  size_type sVar8;
  Pred *pPVar9;
  _Node_iterator_base<core::P<r_exec::_Fact>,_true> this_01;
  reference __x;
  ostream *poVar10;
  Code *pCVar11;
  undefined4 extraout_var;
  reference pPVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Node_iterator_base<core::P<r_exec::Sim>,_true> this_02;
  reference __x_00;
  _Node_iterator_base<core::P<r_exec::Sim>,_true> local_120;
  _Node_iterator_base<core::P<r_exec::Sim>,_true> local_118;
  _Node_iterator_base<core::P<r_exec::Sim>,_true> local_110;
  _Node_iterator_base<core::P<r_exec::Sim>,_true> local_108;
  const_iterator sim;
  Fact *f_p_f_icst_1;
  Pred *prediction_1;
  P<r_exec::_Fact> input_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *__range3_1;
  P<r_exec::_Fact> local_b0;
  P<r_exec::_Fact> input;
  iterator __end3;
  iterator __begin3;
  vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *__range3;
  _Node_iterator_base<core::P<r_exec::_Fact>,_true> local_70;
  _Node_iterator_base<core::P<r_exec::_Fact>,_true> local_68;
  _Node_iterator_base<core::P<r_exec::_Fact>,_true> local_60;
  _Node_iterator_base<core::P<r_exec::_Fact>,_true> local_58;
  const_iterator pred;
  Fact *f_p_f_icst;
  Pred *prediction;
  uint64_t time_to_live;
  uint64_t before;
  uint64_t now;
  Fact *f_icst;
  CSTOverlay *this_local;
  
  this_00 = (CSTController *)(this->super_HLPOverlay).super_Overlay.controller;
  pHVar3 = core::P::operator_cast_to_HLPBindingMap_((P *)&(this->super_HLPOverlay).bindings);
  p_Var4 = &CSTController::get_f_icst(this_00,pHVar3,&this->inputs)->super__Fact;
  uVar5 = (*Now)();
  sVar6 = std::
          unordered_set<core::P<r_exec::Sim>,_r_code::PHash<r_exec::Sim>,_std::equal_to<core::P<r_exec::Sim>_>,_std::allocator<core::P<r_exec::Sim>_>_>
          ::size(&this->simulations);
  if (sVar6 == 0) {
    pHVar3 = core::P<r_exec::HLPBindingMap>::operator->(&(this->super_HLPOverlay).bindings);
    uVar7 = BindingMap::get_fwd_before(&pHVar3->super_BindingMap);
    if (uVar5 < uVar7) {
      prediction = (Pred *)(uVar7 - uVar5);
    }
    else {
      prediction = (Pred *)0x0;
    }
    sVar8 = std::
            unordered_set<core::P<r_exec::_Fact>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<core::P<r_exec::_Fact>_>_>
            ::size(&this->predictions);
    if (sVar8 == 0) {
      CSTController::inject_icst
                ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,(Fact *)p_Var4,
                 this->lowest_cfd,(uint64_t)prediction);
      poVar10 = _Mem::Output(CST_OUT);
      (*Now)();
      r_code::Utils::RelativeTime_abi_cxx11_((ulong)&__range3_1);
      poVar10 = std::operator<<(poVar10,(string *)&__range3_1);
      poVar10 = std::operator<<(poVar10,"\t\t\t\t");
      iVar2 = (*(p_Var4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[2])();
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CONCAT44(extraout_var_01,iVar2));
      poVar10 = std::operator<<(poVar10," icst[");
      pCVar11 = Controller::getObject((this->super_HLPOverlay).super_Overlay.controller);
      iVar2 = (*(pCVar11->super__Object)._vptr__Object[2])();
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CONCAT44(extraout_var_02,iVar2));
      std::operator<<(poVar10,"][");
      std::__cxx11::string::~string((string *)&__range3_1);
      __end3_1 = std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::
                 begin(&this->inputs);
      input_1.object =
           (_Object *)
           std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::end
                     (&this->inputs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
                                 *)&input_1), bVar1) {
        pPVar12 = __gnu_cxx::
                  __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
                  ::operator*(&__end3_1);
        core::P<r_exec::_Fact>::P((P<r_exec::_Fact> *)&prediction_1,pPVar12);
        poVar10 = _Mem::Output(CST_OUT);
        poVar10 = std::operator<<(poVar10," ");
        p_Var4 = core::P<r_exec::_Fact>::operator->((P<r_exec::_Fact> *)&prediction_1);
        iVar2 = (*(p_Var4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[2])();
        std::ostream::operator<<(poVar10,CONCAT44(extraout_var_03,iVar2));
        core::P<r_exec::_Fact>::~P((P<r_exec::_Fact> *)&prediction_1);
        __gnu_cxx::
        __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
        ::operator++(&__end3_1);
      }
      poVar10 = _Mem::Output(CST_OUT);
      poVar10 = std::operator<<(poVar10,"]");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      pPVar9 = (Pred *)operator_new(0x180);
      Pred::Pred(pPVar9,p_Var4,1.0);
      this_01._M_cur = (__node_type *)Fact::operator_new((Fact *)0x150,(size_t)p_Var4);
      Fact::Fact((Fact *)this_01._M_cur,(Code *)pPVar9,uVar5,uVar5,1.0,1.0);
      pred.super__Node_iterator_base<core::P<r_exec::_Fact>,_true>._M_cur =
           (_Node_iterator_base<core::P<r_exec::_Fact>,_true>)
           (_Node_iterator_base<core::P<r_exec::_Fact>,_true>)this_01._M_cur;
      std::__detail::_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true>::_Node_const_iterator
                ((_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true> *)&local_58);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_set<core::P<r_exec::_Fact>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<core::P<r_exec::_Fact>_>_>
           ::begin(&this->predictions);
      std::__detail::_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true>::_Node_const_iterator
                ((_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true> *)&local_60,
                 (_Node_iterator<core::P<r_exec::_Fact>,_true,_true> *)&local_68);
      local_58._M_cur = local_60._M_cur;
      while( true ) {
        local_70._M_cur =
             (__node_type *)
             std::
             unordered_set<core::P<r_exec::_Fact>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<core::P<r_exec::_Fact>_>_>
             ::end(&this->predictions);
        bVar1 = std::__detail::operator!=(&local_58,&local_70);
        if (!bVar1) break;
        __x = std::__detail::_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true>::operator*
                        ((_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true> *)&local_58);
        std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::push_back
                  (&pPVar9->grounds,__x);
        std::__detail::_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true>::operator++
                  ((_Node_const_iterator<core::P<r_exec::_Fact>,_true,_true> *)&local_58);
      }
      CSTController::inject_prediction
                ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,
                 (Fact *)pred.super__Node_iterator_base<core::P<r_exec::_Fact>,_true>._M_cur,
                 this->lowest_cfd,(uint64_t)prediction);
      poVar10 = _Mem::Output(CST_OUT);
      (*Now)();
      r_code::Utils::RelativeTime_abi_cxx11_((ulong)&__range3);
      poVar10 = std::operator<<(poVar10,(string *)&__range3);
      poVar10 = std::operator<<(poVar10,"\t\t\t\t");
      uVar5 = (**(code **)(*(long *)pred.super__Node_iterator_base<core::P<r_exec::_Fact>,_true>.
                                    _M_cur + 0x10))();
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar5);
      poVar10 = std::operator<<(poVar10," pred icst[");
      pCVar11 = Controller::getObject((this->super_HLPOverlay).super_Overlay.controller);
      iVar2 = (*(pCVar11->super__Object)._vptr__Object[2])();
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CONCAT44(extraout_var,iVar2));
      std::operator<<(poVar10,"][");
      std::__cxx11::string::~string((string *)&__range3);
      __end3 = std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::begin
                         (&this->inputs);
      input.object = (_Object *)
                     std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::
                     end(&this->inputs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
                                         *)&input), bVar1) {
        pPVar12 = __gnu_cxx::
                  __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
                  ::operator*(&__end3);
        core::P<r_exec::_Fact>::P(&local_b0,pPVar12);
        poVar10 = _Mem::Output(CST_OUT);
        poVar10 = std::operator<<(poVar10," ");
        p_Var4 = core::P<r_exec::_Fact>::operator->(&local_b0);
        iVar2 = (*(p_Var4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[2])();
        std::ostream::operator<<(poVar10,CONCAT44(extraout_var_00,iVar2));
        core::P<r_exec::_Fact>::~P(&local_b0);
        __gnu_cxx::
        __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
        ::operator++(&__end3);
      }
      poVar10 = _Mem::Output(CST_OUT);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    pPVar9 = (Pred *)operator_new(0x180);
    Pred::Pred(pPVar9,p_Var4,1.0);
    this_02._M_cur = (__node_type *)Fact::operator_new((Fact *)0x150,(size_t)p_Var4);
    Fact::Fact((Fact *)this_02._M_cur,(Code *)pPVar9,uVar5,uVar5,1.0,1.0);
    sim.super__Node_iterator_base<core::P<r_exec::Sim>,_true>._M_cur =
         (_Node_iterator_base<core::P<r_exec::Sim>,_true>)
         (_Node_iterator_base<core::P<r_exec::Sim>,_true>)this_02._M_cur;
    std::__detail::_Node_const_iterator<core::P<r_exec::Sim>,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<core::P<r_exec::Sim>,_true,_true> *)&local_108);
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_set<core::P<r_exec::Sim>,_r_code::PHash<r_exec::Sim>,_std::equal_to<core::P<r_exec::Sim>_>,_std::allocator<core::P<r_exec::Sim>_>_>
         ::begin(&this->simulations);
    std::__detail::_Node_const_iterator<core::P<r_exec::Sim>,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<core::P<r_exec::Sim>,_true,_true> *)&local_110,
               (_Node_iterator<core::P<r_exec::Sim>,_true,_true> *)&local_118);
    local_108._M_cur = local_110._M_cur;
    while( true ) {
      local_120._M_cur =
           (__node_type *)
           std::
           unordered_set<core::P<r_exec::Sim>,_r_code::PHash<r_exec::Sim>,_std::equal_to<core::P<r_exec::Sim>_>,_std::allocator<core::P<r_exec::Sim>_>_>
           ::end(&this->simulations);
      bVar1 = std::__detail::operator!=(&local_108,&local_120);
      if (!bVar1) break;
      __x_00 = std::__detail::_Node_const_iterator<core::P<r_exec::Sim>,_true,_true>::operator*
                         ((_Node_const_iterator<core::P<r_exec::Sim>,_true,_true> *)&local_108);
      std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::push_back
                (&pPVar9->simulations,__x_00);
      std::__detail::_Node_const_iterator<core::P<r_exec::Sim>,_true,_true>::operator++
                ((_Node_const_iterator<core::P<r_exec::Sim>,_true,_true> *)&local_108);
    }
    HLPController::inject_prediction
              ((HLPController *)(this->super_HLPOverlay).super_Overlay.controller,
               (Fact *)sim.super__Node_iterator_base<core::P<r_exec::Sim>,_true>._M_cur,
               this->lowest_cfd);
  }
  return;
}

Assistant:

void CSTOverlay::inject_production()
{
    Fact *f_icst = ((CSTController *)controller)->get_f_icst(bindings, &inputs);
    uint64_t now = Now(); //f_icst->get_reference(0)->trace();

    if (simulations.size() == 0) { // no simulation.
        uint64_t before = bindings->get_fwd_before();
        uint64_t time_to_live;

        if (now >= before) {
            time_to_live = 0;
        } else {
            time_to_live = before - now;
        }

        if (predictions.size()) {
            Pred *prediction = new Pred(f_icst, 1);
            Fact *f_p_f_icst = new Fact(prediction, now, now, 1, 1);
            std::unordered_set<P<_Fact>, PHash<_Fact> >::const_iterator pred;

            for (pred = predictions.begin(); pred != predictions.end(); ++pred) { // add antecedents to the prediction.
                prediction->grounds.push_back(*pred);
            }

            ((CSTController *)controller)->inject_prediction(f_p_f_icst, lowest_cfd, time_to_live); // inject a f->pred->icst in the primary group, no rdx.
            OUTPUT(CST_OUT) << Utils::RelativeTime(Now()) << "				" << f_p_f_icst->get_oid() << " pred icst[" << controller->getObject()->get_oid() << "][";

            for (P<_Fact> input : inputs) {
                OUTPUT(CST_OUT) << " " << input->get_oid();
            }

            OUTPUT(CST_OUT) << std::endl;
        } else {
            ((CSTController *)controller)->inject_icst(f_icst, lowest_cfd, time_to_live); // inject f->icst in the primary and secondary groups, and in the output groups.
            OUTPUT(CST_OUT) << Utils::RelativeTime(Now()) << "				" << f_icst->get_oid() << " icst[" << controller->getObject()->get_oid() << "][";

            for (P<_Fact> input : inputs) {
                OUTPUT(CST_OUT) << " " << input->get_oid();
            }

            OUTPUT(CST_OUT) << "]" << std::endl;
        }
    } else { // there are simulations; the production is therefore a prediction; add the simulations to the latter.
        Pred *prediction = new Pred(f_icst, 1);
        Fact *f_p_f_icst = new Fact(prediction, now, now, 1, 1);
        std::unordered_set<P<Sim>, PHash<Sim> >::const_iterator sim;

        for (sim = simulations.begin(); sim != simulations.end(); ++sim) { // add simulations to the prediction.
            prediction->simulations.push_back(*sim);
        }

        ((HLPController *)controller)->inject_prediction(f_p_f_icst, lowest_cfd); // inject a simulated prediction in the main group.
    }
}